

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestFilter.cpp
# Opt level: O2

SimpleString __thiscall TestFilter::asString(TestFilter *this)

{
  char cVar1;
  char *pcVar2;
  size_t extraout_RDX;
  SimpleString *in_RSI;
  SimpleString SVar4;
  size_t sVar3;
  
  pcVar2 = SimpleString::asCharString(in_RSI);
  SVar4 = StringFromFormat((char *)this,"TestFilter: \"%s\"",pcVar2);
  sVar3 = SVar4.bufferSize_;
  cVar1 = *(char *)((long)&in_RSI[1].buffer_ + 1);
  if (*(char *)&in_RSI[1].buffer_ == '\x01') {
    pcVar2 = " with strict matching";
    if (cVar1 != '\0') {
      pcVar2 = " with strict, invert matching";
    }
  }
  else {
    if (cVar1 == '\0') goto LAB_002b2842;
    pcVar2 = " with invert matching";
  }
  SimpleString::operator+=(&this->filter_,pcVar2);
  sVar3 = extraout_RDX;
LAB_002b2842:
  SVar4.bufferSize_ = sVar3;
  SVar4.buffer_ = (char *)this;
  return SVar4;
}

Assistant:

SimpleString TestFilter::asString() const
{
    SimpleString textFilter =  StringFromFormat("TestFilter: \"%s\"", filter_.asCharString());
    if (strictMatching_ && invertMatching_)
        textFilter += " with strict, invert matching";
    else if (strictMatching_)
        textFilter += " with strict matching";
    else if (invertMatching_)
        textFilter += " with invert matching";

    return textFilter;
}